

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * __thiscall
spvtools::opt::analysis::Pipe::str_abi_cxx11_(string *__return_storage_ptr__,Pipe *this)

{
  ostream *poVar1;
  ostringstream local_190 [8];
  ostringstream oss;
  Pipe *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"pipe(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)&(this->super_Type).field_0x24);
  std::operator<<(poVar1,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string Pipe::str() const {
  std::ostringstream oss;
  oss << "pipe(" << uint32_t(access_qualifier_) << ")";
  return oss.str();
}